

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O2

void rw::registerMatFXPlugin(void)

{
  Driver::registerPlugin(0,0,0x120,matfxOpen,matfxClose);
  ps2::initMatFX();
  xbox::initMatFX();
  d3d8::initMatFX();
  d3d9::initMatFX();
  wdgl::initMatFX();
  gl3::initMatFX();
  matFXGlobals = Atomic::registerPlugin(4,0x120,createAtomicMatFX,(Destructor)0x0,copyAtomicMatFX);
  Atomic::registerPluginStream(0x120,readAtomicMatFX,writeAtomicMatFX,getSizeAtomicMatFX);
  DAT_0014621c = Material::registerPlugin
                           (8,0x120,createMaterialMatFX,destroyMaterialMatFX,copyMaterialMatFX);
  Material::registerPluginStream(0x120,readMaterialMatFX,writeMaterialMatFX,getSizeMaterialMatFX);
  return;
}

Assistant:

void
registerMatFXPlugin(void)
{
	Driver::registerPlugin(PLATFORM_NULL, 0, ID_MATFX,
	                       matfxOpen, matfxClose);
	ps2::initMatFX();
	xbox::initMatFX();
	d3d8::initMatFX();
	d3d9::initMatFX();
	wdgl::initMatFX();
	gl3::initMatFX();

	matFXGlobals.atomicOffset =
	Atomic::registerPlugin(sizeof(int32), ID_MATFX,
	                       createAtomicMatFX, nil, copyAtomicMatFX);
	Atomic::registerPluginStream(ID_MATFX,
	                             readAtomicMatFX,
	                             writeAtomicMatFX,
	                             getSizeAtomicMatFX);

	matFXGlobals.materialOffset =
	Material::registerPlugin(sizeof(MatFX*), ID_MATFX,
	                         createMaterialMatFX, destroyMaterialMatFX,
	                         copyMaterialMatFX);
	Material::registerPluginStream(ID_MATFX,
	                               readMaterialMatFX,
	                               writeMaterialMatFX,
	                               getSizeMaterialMatFX);
}